

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * __thiscall
CLI::Formatter::make_expanded_abi_cxx11_(string *__return_storage_ptr__,Formatter *this,App *sub)

{
  byte bVar1;
  ostream *poVar2;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1c8;
  stringstream local_1a8 [8];
  stringstream out;
  ostream local_198 [376];
  App *local_20;
  App *sub_local;
  Formatter *this_local;
  
  local_20 = sub;
  sub_local = (App *)this;
  this_local = (Formatter *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  App::get_description_abi_cxx11_(&local_1c8,local_20);
  bVar1 = ::std::__cxx11::string::empty();
  ::std::__cxx11::string::~string((string *)&local_1c8);
  if ((bVar1 & 1) == 0) {
    App::get_name_abi_cxx11_(&local_218,local_20);
    poVar2 = ::std::operator<<(local_198,(string *)&local_218);
    poVar2 = ::std::operator<<(poVar2," -> ");
    App::get_description_abi_cxx11_(&local_238,local_20);
    ::std::operator<<(poVar2,(string *)&local_238);
    ::std::__cxx11::string::~string((string *)&local_238);
    ::std::__cxx11::string::~string((string *)&local_218);
  }
  else {
    App::get_name_abi_cxx11_(&local_1f8,local_20);
    ::std::operator<<(local_198,(string *)&local_1f8);
    ::std::__cxx11::string::~string((string *)&local_1f8);
  }
  make_groups_abi_cxx11_(&local_258,this,local_20,Sub);
  ::std::operator<<(local_198,(string *)&local_258);
  ::std::__cxx11::string::~string((string *)&local_258);
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

inline std::string Formatter::make_expanded(const App *sub) const {
    std::stringstream out;
    if(sub->get_description().empty())
        out << sub->get_name();
    else
        out << sub->get_name() << " -> " << sub->get_description();
    out << make_groups(sub, AppFormatMode::Sub);
    return out.str();
}